

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O2

Var Js::TaggedInt::NegateUnchecked(Var aValue)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  int32 iVar4;
  undefined4 *puVar5;
  
  bVar2 = Is(aValue);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x204,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
    if (!bVar2) goto LAB_009ee713;
    *puVar5 = 0;
  }
  if ((undefined1 *)aValue == &DAT_1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x205,"(aValue != ToVarUnchecked(0))",
                                "Do not use NegateUnchecked on zero because NegativeZero is special"
                               );
    if (!bVar2) goto LAB_009ee713;
    *puVar5 = 0;
  }
  else if (aValue == (Var)0x1000080000000) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x206,"(aValue != ToVarUnchecked(k_nMinValue))",
                                "Do not use NegateUnchecked on min value because it cannot be represented"
                               );
    if (!bVar2) goto LAB_009ee713;
    *puVar5 = 0;
  }
  iVar3 = ToInt32(aValue);
  iVar4 = ToInt32(aValue);
  if (iVar4 != iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/TaggedInt.cpp"
                                ,0x217,"(result == ToVarUnchecked( -ToInt32(aValue) ))",
                                "Logic error in NegateUnchecked");
    if (!bVar2) {
LAB_009ee713:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return (Var)((ulong)(uint)-iVar3 | 0x1000000000000);
}

Assistant:

Var TaggedInt::NegateUnchecked(Var aValue)
    {
        AssertMsg( Is(aValue), "Ensure var is actually a 'TaggedInt'");
        AssertMsg( aValue != ToVarUnchecked(0), "Do not use NegateUnchecked on zero because NegativeZero is special");
        AssertMsg( aValue != ToVarUnchecked(k_nMinValue), "Do not use NegateUnchecked on min value because it cannot be represented");

#if INT32VAR
        int n = ToInt32(aValue);
        Var result = ToVarUnchecked( 0 - n );
#else
        int n = reinterpret_cast<int>(aValue);

        // Negation can be done by subtracting from "zero". The following method
        // is just two operations: "load constant; sub"
        // The constant 2 in the following expression
        // a) adjusts for the bias of ToVarUnchecked(0) and
        // b) ensures the tag bit is set
        Var result = reinterpret_cast<Var>( 2 - n );
#endif

        // Check against the long way (shift, negate, shift, or)
        AssertMsg( result == ToVarUnchecked( -ToInt32(aValue) ), "Logic error in NegateUnchecked" );
        return result;
    }